

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsItem::mapRectFromParent(QRectF *__return_storage_ptr__,QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *this_00;
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  undefined8 *puVar7;
  QTransform *pQVar8;
  long in_FS_OFFSET;
  QTransform matrix;
  QTransform QStack_c8;
  bool local_78 [80];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->transformData == (TransformData *)0x0) {
    dVar1 = (this_00->pos).yp;
    dVar2 = rect->yp;
    __return_storage_ptr__->xp = rect->xp - (this_00->pos).xp;
    __return_storage_ptr__->yp = dVar2 - dVar1;
    uVar3 = *(undefined4 *)((long)&rect->w + 4);
    uVar4 = *(undefined4 *)&rect->h;
    uVar5 = *(undefined4 *)((long)&rect->h + 4);
    *(undefined4 *)&__return_storage_ptr__->w = *(undefined4 *)&rect->w;
    *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = uVar3;
    *(undefined4 *)&__return_storage_ptr__->h = uVar4;
    *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = uVar5;
  }
  else {
    puVar7 = &DAT_00700eb8;
    pQVar8 = &QStack_c8;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pQVar8 = *puVar7;
      puVar7 = puVar7 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + 8);
    }
    puVar7 = &DAT_00700e28;
    pQVar8 = &QStack_c8;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pQVar8 = *puVar7;
      puVar7 = puVar7 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + 8);
    }
    QStack_c8._72_2_ = QStack_c8._72_2_ & 0xfc00;
    QGraphicsItemPrivate::combineTransformToParent(this_00,&QStack_c8,(QTransform *)0x0);
    QTransform::inverted(local_78);
    QTransform::mapRect(__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItem::mapRectFromParent(const QRectF &rect) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return rect.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().mapRect(rect);
}